

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

bool __thiscall
libcellml::Importer::ImporterImpl::checkUnitsForCycles
          (ImporterImpl *this,UnitsPtr *units,History *history)

{
  element_type *peVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  IssueImpl *pIVar3;
  AnyCellmlElementImpl *pAVar4;
  ImporterImpl *this_00;
  bool bVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  long *plVar9;
  ImportedEntityImpl *pIVar10;
  element_type *peVar11;
  long *plVar12;
  element_type *peVar13;
  ulong *puVar14;
  undefined8 uVar15;
  ModelPtr model_1;
  string resolvingUrl;
  IssuePtr issue;
  IssuePtr issue_1;
  UnitsPtr importedUnits;
  HistoryEpochPtr h;
  ModelPtr model;
  ModelPtr unitsModel;
  undefined1 local_1a8 [32];
  undefined1 local_188 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_170;
  ImporterImpl *local_168;
  ImportedEntityImpl *local_160;
  long local_158;
  ImportedEntityImpl local_150;
  string local_120;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  IssuePtr local_e0;
  element_type local_d0;
  IssuePtr local_c0;
  string local_b0;
  undefined1 local_90 [16];
  HistoryEpochPtr local_80;
  ImportSource local_70;
  string local_50;
  
  local_168 = (ImporterImpl *)history;
  bVar5 = ImportedEntity::isImport
                    (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->super_ImportedEntity);
  if (!bVar5) {
    sVar7 = Units::unitCount((units->
                             super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr);
    if (sVar7 != 0) {
      sVar7 = 0;
      do {
        Units::unitAttributeReference_abi_cxx11_
                  (&local_120,
                   (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                   sVar7);
        local_188._0_8_ =
             (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_188._8_8_ =
             (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count + 1
            ;
          }
        }
        owningModel((ParentedEntityConstPtr *)local_1a8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
        }
        bVar5 = Model::hasUnits((Model *)local_1a8._0_8_,&local_120);
        if (bVar5) {
          Model::units((Model *)local_188,(string *)local_1a8._0_8_);
          bVar5 = checkUnitsForCycles(this,(UnitsPtr *)local_188,(History *)local_168);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
          }
          if (bVar5) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._M_dataplus._M_p != &local_120.field_2) {
              operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1
                             );
            }
            return true;
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        sVar7 = sVar7 + 1;
        sVar8 = Units::unitCount((units->
                                 super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
      } while (sVar7 < sVar8);
    }
    return false;
  }
  ImportedEntity::importSource
            (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImportedEntity);
  resolvingUrl_abi_cxx11_(&local_120,this,(ImportSourcePtr *)local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  local_1a8._0_8_ = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_1a8._8_8_ =
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_)->_M_use_count + 1;
    }
  }
  owningModel((ParentedEntityConstPtr *)
              &local_70.super_enable_shared_from_this<libcellml::ImportSource>);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  local_188._0_8_ = (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_188._8_8_ =
       (units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_)->_M_use_count + 1;
    }
  }
  modelUrl_abi_cxx11_((string *)local_1a8,this,
                      (ModelPtr *)&local_70.super_enable_shared_from_this<libcellml::ImportSource>);
  createHistoryEpoch((libcellml *)&local_80,(UnitsConstPtr *)local_188,(string *)local_1a8,
                     &local_120);
  peVar1 = (element_type *)(local_1a8 + 0x10);
  if ((element_type *)local_1a8._0_8_ != peVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  ImportedEntity::importSource
            (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImportedEntity);
  local_1a8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"flatten","");
  bVar5 = checkForImportCycles
                    (this,(ImportSourcePtr *)local_188,(History *)local_168,&local_80,
                     (string *)local_1a8);
  if ((element_type *)local_1a8._0_8_ != peVar1) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_188._8_8_);
  }
  bVar6 = true;
  if (bVar5) goto LAB_0021bc28;
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::push_back((vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               *)local_168,&local_80);
  ImportedEntity::importSource
            (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ImportedEntity);
  ImportSource::model(&local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
  }
  if ((string *)local_70.super_Entity._vptr_Entity == (string *)0x0) {
    Issue::IssueImpl::create();
    pIVar3 = (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    NamedEntity::name_abi_cxx11_
              (&local_150.mImportReference,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_NamedEntity);
    plVar9 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_150.mImportReference,0,(char *)0x0,0x294462);
    local_160 = &local_150;
    pIVar10 = (ImportedEntityImpl *)(plVar9 + 2);
    if ((ImportedEntityImpl *)*plVar9 == pIVar10) {
      local_150.mImportSource.
      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pIVar10->mImportSource).
           super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_150.mImportSource.
      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[3];
    }
    else {
      local_150.mImportSource.
      super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pIVar10->mImportSource).
           super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_160 = (ImportedEntityImpl *)*plVar9;
    }
    local_158 = plVar9[1];
    *plVar9 = (long)pIVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_160);
    plVar12 = plVar9 + 2;
    if ((long *)*plVar9 == plVar12) {
      local_f0 = *plVar12;
      lStack_e8 = plVar9[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar12;
      local_100 = (long *)*plVar9;
    }
    local_f8 = plVar9[1];
    *plVar9 = (long)plVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_100,(ulong)local_120._M_dataplus._M_p);
    peVar13 = (element_type *)(plVar9 + 2);
    if ((element_type *)*plVar9 == peVar13) {
      local_188._16_8_ = (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
      ;
      _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[3];
      local_188._0_8_ = (element_type *)(local_188 + 0x10);
    }
    else {
      local_188._16_8_ = (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
      ;
      local_188._0_8_ = (element_type *)*plVar9;
    }
    local_188._8_8_ = plVar9[1];
    *plVar9 = (long)peVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_188);
    peVar13 = (element_type *)(plVar9 + 2);
    if ((element_type *)*plVar9 == peVar13) {
      local_1a8._16_8_ = (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
      ;
      local_1a8._24_8_ = plVar9[3];
      local_1a8._0_8_ = peVar1;
    }
    else {
      local_1a8._16_8_ = (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity
      ;
      local_1a8._0_8_ = (element_type *)*plVar9;
    }
    local_1a8._8_8_ = plVar9[1];
    *plVar9 = (long)peVar13;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    Issue::IssueImpl::setDescription(pIVar3,(string *)local_1a8);
    if ((element_type *)local_1a8._0_8_ != peVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((element_type *)local_188._0_8_ != (element_type *)(local_188 + 0x10)) {
      operator_delete((void *)local_188._0_8_,
                      (ulong)((long)&(((ComponentEntity *)local_188._16_8_)->super_NamedEntity).
                                     super_ParentedEntity.super_Entity._vptr_Entity + 1));
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_160 != &local_150) {
      operator_delete(local_160,
                      (ulong)((long)&((local_150.mImportSource.
                                       super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->super_Entity)._vptr_Entity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150.mImportReference._M_dataplus._M_p != &local_150.mImportReference.field_2) {
      operator_delete(local_150.mImportReference._M_dataplus._M_p,
                      local_150.mImportReference.field_2._M_allocated_capacity + 1);
    }
    pAVar4 = (((local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl->mItem).
              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    ImportedEntity::importSource
              (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ImportedEntity);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar4,(ImportSourcePtr *)local_1a8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
    }
    Issue::IssueImpl::setReferenceRule
              ((local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORTER_NULL_MODEL);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&local_e0);
    if (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar6 = true;
  }
  else {
    ImportedEntity::importReference_abi_cxx11_
              ((string *)local_1a8,
               &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_ImportedEntity);
    Model::units((Model *)local_90,(string *)local_70.super_Entity._vptr_Entity);
    if ((element_type *)local_1a8._0_8_ != peVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((element_type *)local_90._0_8_ == (element_type *)0x0) {
      local_168 = this;
      Issue::IssueImpl::create();
      pIVar3 = (local_c0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_50,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_NamedEntity);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x294462);
      peVar11 = (element_type *)(plVar9 + 2);
      if ((element_type *)*plVar9 == peVar11) {
        local_d0._vptr_Issue = peVar11->_vptr_Issue;
        local_d0.mPimpl = (IssueImpl *)plVar9[3];
        local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_d0
        ;
      }
      else {
        local_d0._vptr_Issue = peVar11->_vptr_Issue;
        local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*plVar9;
      }
      local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[1];
      *plVar9 = (long)peVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_e0);
      paVar2 = &local_150.mImportReference.field_2;
      puVar14 = (ulong *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_150.mImportReference.field_2._M_allocated_capacity = *puVar14;
        local_150.mImportReference.field_2._8_8_ = plVar9[3];
        local_150.mImportReference._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_150.mImportReference.field_2._M_allocated_capacity = *puVar14;
        local_150.mImportReference._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_150.mImportReference._M_string_length = plVar9[1];
      *plVar9 = (long)puVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      ImportedEntity::importReference_abi_cxx11_
                (&local_b0,
                 &((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.mImportReference._M_dataplus._M_p != paVar2) {
        uVar15 = local_150.mImportReference.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_b0._M_string_length + local_150.mImportReference._M_string_length) {
        uVar15 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          uVar15 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar15 < local_b0._M_string_length + local_150.mImportReference._M_string_length)
        goto LAB_0021b928;
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_b0,0,(char *)0x0,
                                    (ulong)local_150.mImportReference._M_dataplus._M_p);
      }
      else {
LAB_0021b928:
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_150.mImportReference,
                                    (ulong)local_b0._M_dataplus._M_p);
      }
      local_160 = &local_150;
      pIVar10 = (ImportedEntityImpl *)(plVar9 + 2);
      if ((ImportedEntityImpl *)*plVar9 == pIVar10) {
        local_150.mImportSource.
        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pIVar10->mImportSource).
             super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_150.mImportSource.
        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[3];
      }
      else {
        local_150.mImportSource.
        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pIVar10->mImportSource).
             super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_160 = (ImportedEntityImpl *)*plVar9;
      }
      local_158 = plVar9[1];
      *plVar9 = (long)pIVar10;
      plVar9[1] = 0;
      *(undefined1 *)
       &(pIVar10->mImportSource).
        super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_160);
      plVar12 = plVar9 + 2;
      if ((long *)*plVar9 == plVar12) {
        local_f0 = *plVar12;
        lStack_e8 = plVar9[3];
        local_100 = &local_f0;
      }
      else {
        local_f0 = *plVar12;
        local_100 = (long *)*plVar9;
      }
      local_f8 = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_100,(ulong)local_120._M_dataplus._M_p);
      peVar13 = (element_type *)(plVar9 + 2);
      if ((element_type *)*plVar9 == peVar13) {
        local_188._16_8_ =
             (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        _Stack_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar9[3];
        local_188._0_8_ = (element_type *)(local_188 + 0x10);
      }
      else {
        local_188._16_8_ =
             (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_188._0_8_ = (element_type *)*plVar9;
      }
      local_188._8_8_ = plVar9[1];
      *plVar9 = (long)peVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(local_188);
      peVar13 = (element_type *)(plVar9 + 2);
      if ((element_type *)*plVar9 == peVar13) {
        local_1a8._16_8_ =
             (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_1a8._24_8_ = plVar9[3];
        local_1a8._0_8_ = peVar1;
      }
      else {
        local_1a8._16_8_ =
             (peVar13->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
        local_1a8._0_8_ = (element_type *)*plVar9;
      }
      local_1a8._8_8_ = plVar9[1];
      *plVar9 = (long)peVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      Issue::IssueImpl::setDescription(pIVar3,(string *)local_1a8);
      this_00 = local_168;
      if ((element_type *)local_1a8._0_8_ != peVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((element_type *)local_188._0_8_ != (element_type *)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,
                        (ulong)((long)&(((ComponentEntity *)local_188._16_8_)->super_NamedEntity).
                                       super_ParentedEntity.super_Entity._vptr_Entity + 1));
      }
      if (local_100 != &local_f0) {
        operator_delete(local_100,local_f0 + 1);
      }
      if (local_160 != &local_150) {
        operator_delete(local_160,
                        (ulong)((long)&((local_150.mImportSource.
                                         super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->super_Entity)._vptr_Entity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150.mImportReference._M_dataplus._M_p != &local_150.mImportReference.field_2) {
        operator_delete(local_150.mImportReference._M_dataplus._M_p,
                        local_150.mImportReference.field_2._M_allocated_capacity + 1);
      }
      if (local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          &local_d0) {
        operator_delete(local_e0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,(long)local_d0._vptr_Issue + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pAVar4 = (((local_c0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl;
      ImportedEntity::importSource
                (&((units->super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_ImportedEntity);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar4,(ImportSourcePtr *)local_1a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_);
      }
      Issue::IssueImpl::setReferenceRule
                ((local_c0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->mPimpl,IMPORTER_MISSING_UNITS);
      Logger::LoggerImpl::addIssue(&this_00->super_LoggerImpl,&local_c0);
      if (local_c0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      bVar6 = true;
    }
    else {
      bVar6 = checkUnitsForCycles(this,(UnitsPtr *)local_90,(History *)local_168);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.super_Entity.mPimpl !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.super_Entity.mPimpl);
  }
LAB_0021bc28:
  if (local_80.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_70.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
      super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_enable_shared_from_this<libcellml::ImportSource>._M_weak_this.
               super___weak_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool Importer::ImporterImpl::checkUnitsForCycles(const UnitsPtr &units, History &history)
{
    // Even if these units are not imported, they might have imported children.
    if (!units->isImport()) {
        for (size_t index = 0; index < units->unitCount(); ++index) {
            std::string ref = units->unitAttributeReference(index);
            // If the child units are imported, check them too.
            auto model = owningModel(units);
            if (model->hasUnits(ref)) {
                if (checkUnitsForCycles(model->units(ref), history)) {
                    return true;
                }
            }
        }
        return false;
    }

    // If they are imported, then they can't have any child unit elements anyway.
    std::string resolvingUrl = ImporterImpl::resolvingUrl(units->importSource());
    auto unitsModel = owningModel(units);
    auto h = createHistoryEpoch(units, modelUrl(unitsModel), resolvingUrl);

    if (checkForImportCycles(units->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = units->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedUnits = model->units(units->importReference());
    if (importedUnits == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Units '" + units->name() + "' imports units named '" + units->importReference() + "' from the model imported from '" + resolvingUrl + "'. The units could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(units->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_UNITS);
        addIssue(issue);
        return true;
    }

    return checkUnitsForCycles(importedUnits, history);
}